

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::RenameFieldInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,RenameFieldInfo *this)

{
  const_reference text;
  idx_t i;
  ulong __n;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ParseInfo::QualifierToString
            (&local_50,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (__n = 0; __n < (ulong)((long)(this->column_path).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->column_path).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    text = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&this->column_path,__n);
    KeywordHelper::WriteOptionallyQuoted(&local_50,text,'\"',true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  KeywordHelper::WriteOptionallyQuoted(&local_50,&this->new_name,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string RenameFieldInfo::ToString() const {
	string result = "";
	result += "ALTER TABLE ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += " IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " RENAME COLUMN ";
	for (idx_t i = 0; i < column_path.size(); i++) {
		if (i > 0) {
			result += ".";
		}
		result += KeywordHelper::WriteOptionallyQuoted(column_path[i]);
	}
	result += " TO ";
	result += KeywordHelper::WriteOptionallyQuoted(new_name);
	result += ";";
	return result;
}